

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isTexCompareResultValid
               (Texture2DArrayView *texture,Sampler *sampler,TexComparePrecision *prec,Vec3 *coord,
               Vec2 *lodBounds,float cmpReference,float result)

{
  int *piVar1;
  Vec3 *pVVar2;
  TexComparePrecision *pTVar3;
  bool bVar4;
  int iVar5;
  deInt32 dVar6;
  FilterMode FVar7;
  ConstPixelBufferAccess *pCVar8;
  ConstPixelBufferAccess *level1;
  float fVar9;
  float fVar10;
  undefined1 local_b8 [8];
  Vector<float,_3> local_b0;
  int local_a4;
  int level_1;
  int maxLevel_1;
  int minLevel_1;
  Vector<float,_3> local_94;
  float local_88;
  float maxF;
  float minF;
  int level;
  int maxLevel;
  int minLevel;
  int maxTexLevel;
  int minTexLevel;
  bool isLinearMipmap;
  bool isNearestMipmap;
  byte local_62;
  undefined1 local_61;
  float local_60;
  bool canBeMinified;
  float fStack_5c;
  bool canBeMagnified;
  float maxLod;
  float minLod;
  int layer;
  int maxLayer;
  int minLayer;
  float maxZ;
  float minZ;
  float depthErr;
  float result_local;
  float cmpReference_local;
  Vec2 *lodBounds_local;
  Vec3 *coord_local;
  TexComparePrecision *prec_local;
  Sampler *sampler_local;
  Texture2DArrayView *texture_local;
  
  minZ = result;
  depthErr = cmpReference;
  _result_local = lodBounds;
  lodBounds_local = (Vec2 *)coord;
  coord_local = (Vec3 *)prec;
  prec_local = (TexComparePrecision *)sampler;
  sampler_local = (Sampler *)texture;
  fVar9 = Vector<float,_3>::z(coord);
  iVar5 = Vector<int,_3>::z((Vector<int,_3> *)coord_local);
  fVar9 = TexVerifierUtil::computeFloatingPointError(fVar9,iVar5);
  iVar5 = Vector<int,_3>::z((Vector<int,_3> *)(coord_local + 1));
  fVar10 = TexVerifierUtil::computeFixedPointError(iVar5);
  maxZ = fVar9 + fVar10;
  fVar9 = Vector<float,_3>::z((Vector<float,_3> *)lodBounds_local);
  minLayer = (int)(fVar9 - maxZ);
  fVar9 = Vector<float,_3>::z((Vector<float,_3> *)lodBounds_local);
  maxLayer = (int)(fVar9 + maxZ);
  dVar6 = deFloorFloatToInt32((float)minLayer + 0.5);
  iVar5 = Texture2DArrayView::getNumLayers((Texture2DArrayView *)sampler_local);
  layer = de::clamp<int>(dVar6,0,iVar5 + -1);
  dVar6 = deFloorFloatToInt32((float)maxLayer + 0.5);
  iVar5 = Texture2DArrayView::getNumLayers((Texture2DArrayView *)sampler_local);
  minLod = (float)de::clamp<int>(dVar6,0,iVar5 + -1);
  maxLod = (float)layer;
  do {
    if ((int)minLod < (int)maxLod) {
      return false;
    }
    fStack_5c = Vector<float,_2>::x(_result_local);
    local_60 = Vector<float,_2>::y(_result_local);
    local_61 = fStack_5c <= (float)(prec_local->uvwBits).m_data[2];
    piVar1 = (prec_local->uvwBits).m_data + 2;
    local_62 = (float)*piVar1 <= local_60 && local_60 != (float)*piVar1;
    if ((bool)local_61) {
      pCVar8 = Texture2DArrayView::getLevel((Texture2DArrayView *)sampler_local,0);
      pTVar3 = prec_local;
      pVVar2 = coord_local;
      FVar7 = (prec_local->uvwBits).m_data[1];
      Vector<float,_3>::swizzle((Vector<float,_3> *)&minTexLevel,(int)lodBounds_local,0);
      bVar4 = isLevelCompareResultValid
                        (pCVar8,(Sampler *)pTVar3,FVar7,(TexComparePrecision *)pVVar2,
                         (Vec2 *)&minTexLevel,(int)maxLod,depthErr,minZ);
      if (bVar4) {
        return true;
      }
    }
    if ((local_62 & 1) != 0) {
      maxTexLevel._3_1_ = TexVerifierUtil::isNearestMipmapFilter((prec_local->uvwBits).m_data[0]);
      maxTexLevel._2_1_ = TexVerifierUtil::isLinearMipmapFilter((prec_local->uvwBits).m_data[0]);
      minLevel = 0;
      iVar5 = Texture2DArrayView::getNumLevels((Texture2DArrayView *)sampler_local);
      maxLevel = iVar5 + -1;
      if ((maxTexLevel._2_1_ & 1) == 0) {
        if ((maxTexLevel._3_1_ & 1) == 0) {
          pCVar8 = Texture2DArrayView::getLevel((Texture2DArrayView *)sampler_local,0);
          pTVar3 = prec_local;
          pVVar2 = coord_local;
          FVar7 = (prec_local->uvwBits).m_data[0];
          Vector<float,_3>::swizzle((Vector<float,_3> *)local_b8,(int)lodBounds_local,0);
          bVar4 = isLevelCompareResultValid
                            (pCVar8,(Sampler *)pTVar3,FVar7,(TexComparePrecision *)pVVar2,
                             (Vec2 *)local_b8,(int)maxLod,depthErr,minZ);
          if (bVar4) {
            return true;
          }
        }
        else {
          fVar9 = deFloatCeil(fStack_5c + 0.5);
          level_1 = de::clamp<int>((int)fVar9 + -1,0,maxLevel);
          fVar9 = ::deFloatFloor(local_60 + 0.5);
          local_a4 = de::clamp<int>((int)fVar9,0,maxLevel);
          for (local_b0.m_data[2] = (float)level_1; (int)local_b0.m_data[2] <= local_a4;
              local_b0.m_data[2] = (float)((int)local_b0.m_data[2] + 1)) {
            pCVar8 = Texture2DArrayView::getLevel
                               ((Texture2DArrayView *)sampler_local,(int)local_b0.m_data[2]);
            pTVar3 = prec_local;
            FVar7 = TexVerifierUtil::getLevelFilter((prec_local->uvwBits).m_data[0]);
            pVVar2 = coord_local;
            Vector<float,_3>::swizzle((Vector<float,_3> *)(local_b8 + 8),(int)lodBounds_local,0);
            bVar4 = isLevelCompareResultValid
                              (pCVar8,(Sampler *)pTVar3,FVar7,(TexComparePrecision *)pVVar2,
                               (Vec2 *)(local_b8 + 8),(int)maxLod,depthErr,minZ);
            if (bVar4) {
              return true;
            }
          }
        }
      }
      else {
        fVar9 = ::deFloatFloor(fStack_5c);
        level = de::clamp<int>((int)fVar9,0,maxLevel + -1);
        fVar9 = ::deFloatFloor(local_60);
        minF = (float)de::clamp<int>((int)fVar9,0,maxLevel + -1);
        for (maxF = (float)level; (int)maxF <= (int)minF; maxF = (float)((int)maxF + 1)) {
          local_88 = de::clamp<float>(fStack_5c - (float)(int)maxF,0.0,1.0);
          local_94.m_data[2] = de::clamp<float>(local_60 - (float)(int)maxF,0.0,1.0);
          pCVar8 = Texture2DArrayView::getLevel((Texture2DArrayView *)sampler_local,(int)maxF);
          level1 = Texture2DArrayView::getLevel((Texture2DArrayView *)sampler_local,(int)maxF + 1);
          pTVar3 = prec_local;
          FVar7 = TexVerifierUtil::getLevelFilter((prec_local->uvwBits).m_data[0]);
          pVVar2 = coord_local;
          Vector<float,_3>::swizzle(&local_94,(int)lodBounds_local,0);
          fVar9 = maxLod;
          Vector<float,_2>::Vector((Vector<float,_2> *)&maxLevel_1,local_88,local_94.m_data[2]);
          bVar4 = isMipmapLinearCompareResultValid
                            (pCVar8,level1,(Sampler *)pTVar3,FVar7,(TexComparePrecision *)pVVar2,
                             (Vec2 *)&local_94,(int)fVar9,(Vec2 *)&maxLevel_1,depthErr,minZ);
          if (bVar4) {
            return true;
          }
        }
      }
    }
    maxLod = (float)((int)maxLod + 1);
  } while( true );
}

Assistant:

bool isTexCompareResultValid (const Texture2DArrayView& texture, const Sampler& sampler, const TexComparePrecision& prec, const Vec3& coord, const Vec2& lodBounds, const float cmpReference, const float result)
{
	const float		depthErr	= computeFloatingPointError(coord.z(), prec.coordBits.z()) + computeFixedPointError(prec.uvwBits.z());
	const float		minZ		= coord.z()-depthErr;
	const float		maxZ		= coord.z()+depthErr;
	const int		minLayer	= de::clamp(deFloorFloatToInt32(minZ + 0.5f), 0, texture.getNumLayers()-1);
	const int		maxLayer	= de::clamp(deFloorFloatToInt32(maxZ + 0.5f), 0, texture.getNumLayers()-1);

	DE_ASSERT(isSamplerSupported(sampler));

	for (int layer = minLayer; layer <= maxLayer; layer++)
	{
		const float		minLod			= lodBounds.x();
		const float		maxLod			= lodBounds.y();
		const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
		const bool		canBeMinified	= maxLod > sampler.lodThreshold;

		if (canBeMagnified)
		{
			if (isLevelCompareResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coord.swizzle(0,1), layer, cmpReference, result))
				return true;
		}

		if (canBeMinified)
		{
			const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
			const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
			const int	minTexLevel		= 0;
			const int	maxTexLevel		= texture.getNumLevels()-1;

			DE_ASSERT(minTexLevel < maxTexLevel);

			if (isLinearMipmap)
			{
				const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
					const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

					if (isMipmapLinearCompareResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coord.swizzle(0,1), layer, Vec2(minF, maxF), cmpReference, result))
						return true;
				}
			}
			else if (isNearestMipmap)
			{
				// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
				//		 decision to allow floor(lod + 0.5) as well.
				const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					if (isLevelCompareResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coord.swizzle(0,1), layer, cmpReference, result))
						return true;
				}
			}
			else
			{
				if (isLevelCompareResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coord.swizzle(0,1), layer, cmpReference, result))
					return true;
			}
		}
	}

	return false;
}